

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O0

int getl(char **lineptr,FILE *fp)

{
  int __c;
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char *temp;
  size_t n;
  size_t new_length;
  ssize_t count;
  ssize_t buf_pos;
  int ch;
  FILE *fp_local;
  char **lineptr_local;
  
  count = 0;
  new_length = 2;
  temp = (char *)0x50;
  if ((lineptr == (char **)0x0) || (fp == (FILE *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    lineptr_local._4_4_ = -1;
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      piVar1 = __errno_location();
      *piVar1 = 0;
    }
    if (*lineptr == (char *)0x0) {
      pcVar2 = (char *)malloc(0x50);
      *lineptr = pcVar2;
      if (*lineptr == (char *)0x0) {
        return -1;
      }
    }
    while (__c = getc((FILE *)fp), __c != -1) {
      piVar1 = __errno_location();
      if (*piVar1 != 0) {
        return -1;
      }
      if (temp < new_length) {
        pcVar2 = (char *)((long)temp << 1);
        if (pcVar2 <= temp) {
          piVar1 = __errno_location();
          *piVar1 = 0xc;
          ungetc(__c,(FILE *)fp);
          return -1;
        }
        pcVar3 = (char *)realloc(*lineptr,(size_t)pcVar2);
        if (pcVar3 == (char *)0x0) {
          ungetc(__c,(FILE *)fp);
          return -1;
        }
        *lineptr = pcVar3;
        temp = pcVar2;
      }
      lVar4 = count + 1;
      (*lineptr)[count] = (char)__c;
      count = lVar4;
      if (__c == 10) break;
      if (new_length == 0x7fffffffffffffff) {
        piVar1 = __errno_location();
        *piVar1 = 0xc;
        return -1;
      }
      new_length = new_length + 1;
    }
    (*lineptr)[count] = '\0';
    if (count == 0) {
      count = -1;
    }
    lineptr_local._4_4_ = (int)count;
  }
  return lineptr_local._4_4_;
}

Assistant:

int getl(char **lineptr, FILE *fp) {
		int ch;
		ssize_t buf_pos = 0;
		ssize_t count = 2; /* Always buf_pos + 2 (see below). */
		size_t new_length = 0;
		size_t n = BUFSIZE;
		char *temp;

		if ((lineptr == NULL) || (fp == NULL)) {
			errno = EINVAL;
			return -1;
		}

		if (errno != 0)
			errno = 0;

		if (*lineptr == NULL) {
			*lineptr = malloc(n * sizeof(char));

			if (*lineptr == NULL) {
				return -1; /* Out of memory. */
			}
		}

		/*
		 * There are buf_pos characters in the buffer.  When we read another
		 * character, we want to store it, and we also need enough
		 * room for a nul string. So we need to realloc as soon as our capacity
		 * becomes less than buf_pos + 2.
		 * Hence the variable "count" which always equals buf_pos + 2.
		 */

		while ((ch = getc(fp)) != EOF) {
			if (errno != 0)
				return -1;

			if (count > n) { /* current chars read is going to blow our buffer - add more */
				new_length = n * 2; /* double the current buffer size */
				if (new_length <= n) { /* Overflow. */
					errno = ENOMEM;
					/* We couldn't store the character, */
					/* so put it back on the stream. */
					ungetc(ch, fp);
					return -1;
				}
				temp = (char *)realloc(*lineptr, new_length * sizeof(char)); /* realloc to a temp */
				if (temp == NULL) {
					ungetc(ch, fp);
					return -1;
				}
				n = new_length; /* set n to the new length we were able to get from system */
				*lineptr = temp; /* set line to this new temp string */
			}

			(*lineptr)[buf_pos++] = (char)ch; /* set this char in the string at buf_pos and THEN increment buf_pos */

			if (ch == '\n') /* eol */
				break;

			if (count == SSIZE_MAX) { /* SSIZE_MAX is 32767 - posix def */
				/* We'll overflow ssize_t on the next round, since the return
				 * type is SSIZE_T */
				errno = ENOMEM;
				return -1;
			}
			count++; /* increment ch count */
		}

		(*lineptr)[buf_pos] = '\0'; /* set last position to \0 */

		if (buf_pos == 0) { /* nothing in the file? */
			buf_pos = -1;
		}
		return buf_pos;
	}